

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O2

void mpp_osal_free(char *caller,void *ptr)

{
  uint uVar1;
  MppMemService *this;
  MppMemOps ops;
  size_t size_0;
  void *ptr_00;
  size_t size;
  AutoMutex auto_lock;
  
  this = MppMemService::get_inst();
  if (ptr != (void *)0x0) {
    uVar1 = this->debug;
    if (uVar1 == 0) {
      os_free(ptr);
      return;
    }
    size = 0;
    auto_lock.mLock = this->m_lock;
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    if ((uVar1 & 0x20) == 0) {
      ptr_00 = (void *)((long)ptr - (ulong)(uVar1 * 2 & 0x20));
      MppMemService::del_node(this,caller,ptr,&size);
      size_0 = size;
      MppMemService::chk_mem(this,caller,ptr,size);
      os_free(ptr_00);
      ops = MEM_FREE;
    }
    else {
      ptr_00 = MppMemService::delay_del_node(this,caller,ptr,&size);
      if (ptr_00 != (void *)0x0) {
        os_free((void *)((long)ptr_00 + -0x20));
      }
      ops = MEM_FREE_DELAY;
      size_0 = size;
    }
    MppMemService::add_log(this,ops,caller,ptr,ptr_00,size_0,0);
    Mutex::Autolock::~Autolock(&auto_lock);
  }
  return;
}

Assistant:

void mpp_osal_free(const char *caller, void *ptr)
{
    MppMemService *srv = MppMemService::get_inst();
    RK_U32 debug = srv->debug;

    if (NULL == ptr)
        return;

    if (!debug) {
        os_free(ptr);
        return ;
    }

    size_t size = 0;

    AutoMutex auto_lock(srv->m_lock);
    if (debug & MEM_POISON) {
        // NODE: keep this node and  delete delay node
        void *ret = srv->delay_del_node(caller, ptr, &size);
        if (ret)
            os_free((RK_U8 *)ret - MEM_ALIGN);

        srv->add_log(MEM_FREE_DELAY, caller, ptr, ret, size, 0);
    } else {
        void *ptr_real = (RK_U8 *)ptr - MEM_HEAD_ROOM(debug);
        // NODE: delete node and return size here
        srv->del_node(caller, ptr, &size);
        srv->chk_mem(caller, ptr, size);
        os_free(ptr_real);
        srv->add_log(MEM_FREE, caller, ptr, ptr_real, size, 0);
    }
}